

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2region_coverer.cc
# Opt level: O2

void S2RegionCoverer::FloodFill
               (S2Region *region,S2CellId start,vector<S2CellId,_std::allocator<S2CellId>_> *output)

{
  pointer pSVar1;
  int iVar2;
  int edge;
  long lVar3;
  __ireturn_type _Var4;
  vector<S2CellId,_std::allocator<S2CellId>_> frontier;
  S2CellId nbr;
  S2CellId id;
  unordered_set<S2CellId,_S2CellIdHash,_std::equal_to<S2CellId>,_std::allocator<S2CellId>_> all;
  S2CellId neighbors [4];
  _Vector_base<S2CellId,_std::allocator<S2CellId>_> local_d8;
  value_type local_c0;
  S2Region *local_b8;
  value_type local_b0;
  S2CellId local_a8;
  _Hashtable<S2CellId,_S2CellId,_std::allocator<S2CellId>,_std::__detail::_Identity,_std::equal_to<S2CellId>,_S2CellIdHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_a0;
  S2Cell local_68;
  
  local_a0._M_buckets = &local_a0._M_single_bucket;
  local_a0._M_bucket_count = 1;
  local_a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a0._M_element_count = 0;
  local_a0._M_rehash_policy._M_max_load_factor = 1.0;
  local_a0._M_rehash_policy._M_next_resize = 0;
  local_a0._M_single_bucket = (__node_base_ptr)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pSVar1 = (output->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((output->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
      super__Vector_impl_data._M_finish != pSVar1) {
    (output->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
    super__Vector_impl_data._M_finish = pSVar1;
  }
  local_c0.id_ = start.id_;
  std::__detail::
  _Insert_base<S2CellId,_S2CellId,_std::allocator<S2CellId>,_std::__detail::_Identity,_std::equal_to<S2CellId>,_S2CellIdHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::insert((_Insert_base<S2CellId,_S2CellId,_std::allocator<S2CellId>,_std::__detail::_Identity,_std::equal_to<S2CellId>,_S2CellIdHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            *)&local_a0,&local_c0);
  std::vector<S2CellId,_std::allocator<S2CellId>_>::push_back
            ((vector<S2CellId,_std::allocator<S2CellId>_> *)&local_d8,&local_c0);
  local_b8 = region;
  while (local_d8._M_impl.super__Vector_impl_data._M_start !=
         local_d8._M_impl.super__Vector_impl_data._M_finish) {
    local_a8.id_ = local_d8._M_impl.super__Vector_impl_data._M_finish[-1].id_;
    local_d8._M_impl.super__Vector_impl_data._M_finish =
         local_d8._M_impl.super__Vector_impl_data._M_finish + -1;
    S2Cell::S2Cell(&local_68,local_a8);
    iVar2 = (*region->_vptr_S2Region[7])(region,&local_68);
    if ((char)iVar2 != '\0') {
      std::vector<S2CellId,_std::allocator<S2CellId>_>::push_back(output,&local_a8);
      local_68._16_8_ = 0;
      local_68.uv_.bounds_[0].bounds_.c_[0] = 0.0;
      local_68.super_S2Region._vptr_S2Region = (_func_int **)0x0;
      local_68._8_8_ = 0;
      S2CellId::GetEdgeNeighbors(&local_a8,(S2CellId *)&local_68);
      for (lVar3 = 0; region = local_b8, lVar3 != 4; lVar3 = lVar3 + 1) {
        local_b0.id_ = (uint64)local_68.uv_.bounds_[0].bounds_.c_[lVar3 + -3];
        _Var4 = std::__detail::
                _Insert_base<S2CellId,_S2CellId,_std::allocator<S2CellId>,_std::__detail::_Identity,_std::equal_to<S2CellId>,_S2CellIdHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::insert((_Insert_base<S2CellId,_S2CellId,_std::allocator<S2CellId>,_std::__detail::_Identity,_std::equal_to<S2CellId>,_S2CellIdHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)&local_a0,&local_b0);
        if (((undefined1  [16])_Var4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          std::vector<S2CellId,_std::allocator<S2CellId>_>::push_back
                    ((vector<S2CellId,_std::allocator<S2CellId>_> *)&local_d8,&local_b0);
        }
      }
    }
  }
  std::_Vector_base<S2CellId,_std::allocator<S2CellId>_>::~_Vector_base(&local_d8);
  std::
  _Hashtable<S2CellId,_S2CellId,_std::allocator<S2CellId>,_std::__detail::_Identity,_std::equal_to<S2CellId>,_S2CellIdHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_a0);
  return;
}

Assistant:

void S2RegionCoverer::FloodFill(const S2Region& region, S2CellId start,
                                vector<S2CellId>* output) {
  unordered_set<S2CellId, S2CellIdHash> all;
  vector<S2CellId> frontier;
  output->clear();
  all.insert(start);
  frontier.push_back(start);
  while (!frontier.empty()) {
    S2CellId id = frontier.back();
    frontier.pop_back();
    if (!region.MayIntersect(S2Cell(id))) continue;
    output->push_back(id);

    S2CellId neighbors[4];
    id.GetEdgeNeighbors(neighbors);
    for (int edge = 0; edge < 4; ++edge) {
      S2CellId nbr = neighbors[edge];
      if (all.insert(nbr).second) {
        frontier.push_back(nbr);
      }
    }
  }
}